

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O0

void secp256k1_sha256_initialize_tagged(secp256k1_sha256 *hash,uchar *tag,size_t taglen)

{
  secp256k1_sha256 *in_RDI;
  uchar buf [32];
  size_t in_stack_ffffffffffffffd0;
  uchar *in_stack_ffffffffffffffd8;
  secp256k1_sha256 *in_stack_ffffffffffffffe0;
  
  secp256k1_sha256_initialize(in_RDI);
  secp256k1_sha256_write
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  secp256k1_sha256_finalize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  secp256k1_sha256_initialize(in_RDI);
  secp256k1_sha256_write
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  secp256k1_sha256_write
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

static void secp256k1_sha256_initialize_tagged(secp256k1_sha256 *hash, const unsigned char *tag, size_t taglen) {
    unsigned char buf[32];
    secp256k1_sha256_initialize(hash);
    secp256k1_sha256_write(hash, tag, taglen);
    secp256k1_sha256_finalize(hash, buf);

    secp256k1_sha256_initialize(hash);
    secp256k1_sha256_write(hash, buf, 32);
    secp256k1_sha256_write(hash, buf, 32);
}